

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanUnitStringPhase2(string *unit_string)

{
  ulong uVar1;
  size_type sVar2;
  string *psVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  bool local_71;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  char local_49;
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  ulong local_28;
  size_type dpos;
  size_type len;
  string *psStack_10;
  bool changed;
  string *unit_string_local;
  
  len._7_1_ = 0;
  psStack_10 = unit_string;
  dpos = std::__cxx11::string::length();
  bVar4 = bracketModifiers(psStack_10);
  if (bVar4) {
    len._7_1_ = 1;
  }
  local_28 = std::__cxx11::string::find_first_of((char)psStack_10,0x2d);
  while (psVar3 = psStack_10, uVar1 = local_28, local_28 != 0xffffffffffffffff) {
    lVar5 = std::__cxx11::string::size();
    if (((uVar1 < lVar5 - 1U) &&
        (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10), '/' < *pcVar6)) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psStack_10), *pcVar6 < ':')) {
      local_28 = std::__cxx11::string::find_first_of((char)psStack_10,0x2d);
    }
    else {
      std::__cxx11::string::erase((ulong)psStack_10,local_28);
      local_28 = std::__cxx11::string::find_first_of((char)psStack_10,0x2d);
    }
  }
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_48 = (char *)std::__cxx11::string::end();
  local_49 = '+';
  local_38 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_48,&local_49);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
  local_60._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
  std::__cxx11::string::erase(psVar3,local_30,local_58);
  clearEmptySegments(psStack_10);
  sVar2 = dpos;
  local_71 = true;
  if ((len._7_1_ & 1) == 0) {
    sVar7 = std::__cxx11::string::length();
    local_71 = sVar2 != sVar7;
  }
  return local_71;
}

Assistant:

static bool cleanUnitStringPhase2(std::string& unit_string)
{
    bool changed{false};
    auto len = unit_string.length();

    if (bracketModifiers(unit_string)) {
        changed = true;
    }

    // cleanup extraneous dashes
    auto dpos = unit_string.find_first_of('-');
    while (dpos != std::string::npos) {
        if (dpos < unit_string.size() - 1) {
            if (unit_string[dpos + 1] >= '0' && unit_string[dpos + 1] <= '9') {
                dpos = unit_string.find_first_of('-', dpos + 1);
                continue;
            }
        }

        unit_string.erase(dpos, 1);
        dpos = unit_string.find_first_of('-', dpos);
    }
    unit_string.erase(
        std::remove(unit_string.begin(), unit_string.end(), '+'),
        unit_string.end());

    clearEmptySegments(unit_string);

    return changed || (len != unit_string.length());
}